

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateSnapshot.cxx
# Opt level: O2

void __thiscall cmStateSnapshot::InitializeFromParent(cmStateSnapshot *this)

{
  StackIter begin;
  StackIter end;
  bool bVar1;
  PointerType pSVar2;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_00;
  PointerType pBVar3;
  PointerType pBVar4;
  PointerType pBVar5;
  PointerType pBVar6;
  PositionType *this_01;
  PositionType parent;
  iterator local_78;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  this_01 = &this->Position;
  pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_01);
  local_78.Tree = (pSVar2->DirectoryParent).Tree;
  local_78.Position = (pSVar2->DirectoryParent).Position;
  pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_01);
  bVar1 = cmLinkedTree<cmDefinitions>::iterator::IsValid(&pSVar2->Vars);
  if (!bVar1) {
    __assert_fail("this->Position->Vars.IsValid()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmStateSnapshot.cxx"
                  ,0x16b,"void cmStateSnapshot::InitializeFromParent()");
  }
  pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_78);
  bVar1 = cmLinkedTree<cmDefinitions>::iterator::IsValid(&pSVar2->Vars);
  if (bVar1) {
    pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_78);
    begin.Tree = (pSVar2->Vars).Tree;
    begin.Position = (pSVar2->Vars).Position;
    pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_78);
    end.Tree = (pSVar2->Root).Tree;
    end.Position = (pSVar2->Root).Position;
    cmDefinitions::MakeClosure((cmDefinitions *)&local_68,begin,end);
    pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_01);
    this_00 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)cmLinkedTree<cmDefinitions>::iterator::operator*(&pSVar2->Vars);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::operator=(this_00,&local_68);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_68);
    pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_78);
    pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                       (&pSVar2->BuildSystemDirectory);
    pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_01);
    pBVar4 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                       (&pSVar2->BuildSystemDirectory);
    pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_78);
    pBVar5 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                       (&pSVar2->BuildSystemDirectory);
    pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_01);
    pBVar6 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                       (&pSVar2->BuildSystemDirectory);
    pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_01);
    InitializeContentFromParent<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>,unsigned_long>
              (&pBVar3->IncludeDirectories,&pBVar4->IncludeDirectories,
               &pBVar5->IncludeDirectoryBacktraces,&pBVar6->IncludeDirectoryBacktraces,
               &pSVar2->IncludeDirectoryPosition);
    pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_78);
    pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                       (&pSVar2->BuildSystemDirectory);
    pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_01);
    pBVar4 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                       (&pSVar2->BuildSystemDirectory);
    pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_78);
    pBVar5 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                       (&pSVar2->BuildSystemDirectory);
    pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_01);
    pBVar6 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                       (&pSVar2->BuildSystemDirectory);
    pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_01);
    InitializeContentFromParent<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>,unsigned_long>
              (&pBVar3->CompileDefinitions,&pBVar4->CompileDefinitions,
               &pBVar5->CompileDefinitionsBacktraces,&pBVar6->CompileDefinitionsBacktraces,
               &pSVar2->CompileDefinitionsPosition);
    pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_78);
    pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                       (&pSVar2->BuildSystemDirectory);
    pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_01);
    pBVar4 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                       (&pSVar2->BuildSystemDirectory);
    pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_78);
    pBVar5 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                       (&pSVar2->BuildSystemDirectory);
    pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_01);
    pBVar6 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                       (&pSVar2->BuildSystemDirectory);
    pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_01);
    InitializeContentFromParent<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>,unsigned_long>
              (&pBVar3->CompileOptions,&pBVar4->CompileOptions,&pBVar5->CompileOptionsBacktraces,
               &pBVar6->CompileOptionsBacktraces,&pSVar2->CompileOptionsPosition);
    return;
  }
  __assert_fail("parent->Vars.IsValid()",
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmStateSnapshot.cxx"
                ,0x16c,"void cmStateSnapshot::InitializeFromParent()");
}

Assistant:

void cmStateSnapshot::InitializeFromParent()
{
  cmStateDetail::PositionType parent = this->Position->DirectoryParent;
  assert(this->Position->Vars.IsValid());
  assert(parent->Vars.IsValid());

  *this->Position->Vars =
    cmDefinitions::MakeClosure(parent->Vars, parent->Root);

  InitializeContentFromParent(
    parent->BuildSystemDirectory->IncludeDirectories,
    this->Position->BuildSystemDirectory->IncludeDirectories,
    parent->BuildSystemDirectory->IncludeDirectoryBacktraces,
    this->Position->BuildSystemDirectory->IncludeDirectoryBacktraces,
    this->Position->IncludeDirectoryPosition);

  InitializeContentFromParent(
    parent->BuildSystemDirectory->CompileDefinitions,
    this->Position->BuildSystemDirectory->CompileDefinitions,
    parent->BuildSystemDirectory->CompileDefinitionsBacktraces,
    this->Position->BuildSystemDirectory->CompileDefinitionsBacktraces,
    this->Position->CompileDefinitionsPosition);

  InitializeContentFromParent(
    parent->BuildSystemDirectory->CompileOptions,
    this->Position->BuildSystemDirectory->CompileOptions,
    parent->BuildSystemDirectory->CompileOptionsBacktraces,
    this->Position->BuildSystemDirectory->CompileOptionsBacktraces,
    this->Position->CompileOptionsPosition);
}